

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvprims.c
# Opt level: O3

sexp_conflict
sexp_init_library(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,char *version
                 ,char *abi)

{
  int iVar1;
  int *piVar2;
  sexp_conflict psVar3;
  sexp_conflict local_78;
  sexp_conflict tmp;
  sexp_conflict name;
  sexp_gc_var_t local_60;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  name = (sexp_conflict)0x43e;
  tmp = (sexp_conflict)0x43e;
  local_78 = (sexp_conflict)0x43e;
  iVar1 = strcmp(version,"0.11.0");
  psVar3 = (sexp_conflict)0xb3e;
  if (iVar1 == 0) {
    iVar1 = strncmp(abi,"cv-gm*uh",8);
    if (iVar1 == 0) {
      local_60.var = &name;
      local_40.next = &local_60;
      local_60.next = (ctx->value).context.saves;
      local_40.var = &tmp;
      local_50.next = &local_40;
      (ctx->value).context.saves = &local_50;
      local_50.var = &local_78;
      psVar3 = (sexp_conflict)sexp_intern(ctx,"SEXP_F16",8);
      name = psVar3;
      tmp = (sexp_conflict)sexp_make_integer(ctx,0xf,0);
      sexp_env_define(ctx,env,psVar3,tmp);
      psVar3 = (sexp_conflict)sexp_intern(ctx,"SEXP_F8",7);
      name = psVar3;
      tmp = (sexp_conflict)sexp_make_integer(ctx,0xe,0);
      sexp_env_define(ctx,env,psVar3,tmp);
      psVar3 = (sexp_conflict)sexp_intern(ctx,"SEXP_C128",9);
      name = psVar3;
      tmp = (sexp_conflict)sexp_make_integer(ctx,0xd,0);
      sexp_env_define(ctx,env,psVar3,tmp);
      psVar3 = (sexp_conflict)sexp_intern(ctx,"SEXP_C64",8);
      name = psVar3;
      tmp = (sexp_conflict)sexp_make_integer(ctx,0xc,0);
      sexp_env_define(ctx,env,psVar3,tmp);
      psVar3 = (sexp_conflict)sexp_intern(ctx,"SEXP_F64",8);
      name = psVar3;
      tmp = (sexp_conflict)sexp_make_integer(ctx,0xb,0);
      sexp_env_define(ctx,env,psVar3,tmp);
      psVar3 = (sexp_conflict)sexp_intern(ctx,"SEXP_F32",8);
      name = psVar3;
      tmp = (sexp_conflict)sexp_make_integer(ctx,10,0);
      sexp_env_define(ctx,env,psVar3,tmp);
      psVar3 = (sexp_conflict)sexp_intern(ctx,"SEXP_U64",8);
      name = psVar3;
      tmp = (sexp_conflict)sexp_make_integer(ctx,9,0);
      sexp_env_define(ctx,env,psVar3,tmp);
      psVar3 = (sexp_conflict)sexp_intern(ctx,"SEXP_S64",8);
      name = psVar3;
      tmp = (sexp_conflict)sexp_make_integer(ctx,8,0);
      sexp_env_define(ctx,env,psVar3,tmp);
      psVar3 = (sexp_conflict)sexp_intern(ctx,"SEXP_U32",8);
      name = psVar3;
      tmp = (sexp_conflict)sexp_make_integer(ctx,7,0);
      sexp_env_define(ctx,env,psVar3,tmp);
      psVar3 = (sexp_conflict)sexp_intern(ctx,"SEXP_S32",8);
      name = psVar3;
      tmp = (sexp_conflict)sexp_make_integer(ctx,6,0);
      sexp_env_define(ctx,env,psVar3,tmp);
      psVar3 = (sexp_conflict)sexp_intern(ctx,"SEXP_U16",8);
      name = psVar3;
      tmp = (sexp_conflict)sexp_make_integer(ctx,5,0);
      sexp_env_define(ctx,env,psVar3,tmp);
      psVar3 = (sexp_conflict)sexp_intern(ctx,"SEXP_S16",8);
      name = psVar3;
      tmp = (sexp_conflict)sexp_make_integer(ctx,4,0);
      sexp_env_define(ctx,env,psVar3,tmp);
      psVar3 = (sexp_conflict)sexp_intern(ctx,"SEXP_U8",7);
      name = psVar3;
      tmp = (sexp_conflict)sexp_make_integer(ctx,3,0);
      sexp_env_define(ctx,env,psVar3,tmp);
      psVar3 = (sexp_conflict)sexp_intern(ctx,"SEXP_S8",7);
      name = psVar3;
      tmp = (sexp_conflict)sexp_make_integer(ctx,2,0);
      sexp_env_define(ctx,env,psVar3,tmp);
      psVar3 = (sexp_conflict)sexp_intern(ctx,"SEXP_U1",7);
      name = psVar3;
      tmp = (sexp_conflict)sexp_make_integer(ctx,1,0);
      sexp_env_define(ctx,env,psVar3,tmp);
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"c128vector-set!",3,0,"sexp_c128vector_set_x_stub",
                            sexp_c128vector_set_x_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0x43e;
        (local_78->value).port.offset = 0x4d;
        (local_78->value).port.line = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"c128vector-ref",2,0,"sexp_c128vector_ref_stub",
                            sexp_c128vector_ref_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 1;
        (local_78->value).port.offset = 0x4d;
        (local_78->value).port.line = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"c64vector-set!",3,0,"sexp_c64vector_set_x_stub",
                            sexp_c64vector_set_x_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0x43e;
        (local_78->value).port.offset = 0x4d;
        (local_78->value).port.line = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"c64vector-ref",2,0,"sexp_c64vector_ref_stub",
                            sexp_c64vector_ref_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 1;
        (local_78->value).port.offset = 0x4d;
        (local_78->value).port.line = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"f64vector-set!",3,0,"sexp_f64vector_set_x_stub",
                            sexp_f64vector_set_x_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0x43e;
        (local_78->value).type.id = (sexp)0x4d;
        (local_78->value).port.offset = 5;
        (local_78->value).port.line = 0x17;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"f64vector-ref",2,0,"sexp_f64vector_ref_stub",
                            sexp_f64vector_ref_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0x17;
        (local_78->value).type.id = (sexp)0x4d;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"f32vector-set!",3,0,"sexp_f32vector_set_x_stub",
                            sexp_f32vector_set_x_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0x43e;
        (local_78->value).type.id = (sexp)0x4d;
        (local_78->value).port.offset = 5;
        (local_78->value).port.line = 0x17;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"f32vector-ref",2,0,"sexp_f32vector_ref_stub",
                            sexp_f32vector_ref_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0x17;
        (local_78->value).type.id = (sexp)0x4d;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"f16vector-set!",3,0,"sexp_f16vector_set_x_stub",
                            sexp_f16vector_set_x_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0x43e;
        (local_78->value).type.id = (sexp)0x4d;
        (local_78->value).port.offset = 5;
        (local_78->value).port.line = 0x17;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"f16vector-ref",2,0,"sexp_f16vector_ref_stub",
                            sexp_f16vector_ref_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0x17;
        (local_78->value).type.id = (sexp)0x4d;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"f8vector-set!",3,0,"sexp_f8vector_set_x_stub",
                            sexp_f8vector_set_x_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0x43e;
        (local_78->value).type.id = (sexp)0x4d;
        (local_78->value).port.offset = 5;
        (local_78->value).port.line = 0x17;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"f8vector-ref",2,0,"sexp_f8vector_ref_stub",
                            sexp_f8vector_ref_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0x17;
        (local_78->value).type.id = (sexp)0x4d;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"s64vector-set!",3,0,"sexp_s64vector_set_x_stub",
                            sexp_s64vector_set_x_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0x43e;
        (local_78->value).type.id = (sexp)0x4d;
        (local_78->value).port.offset = 5;
        (local_78->value).port.line = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"s64vector-ref",2,0,"sexp_s64vector_ref_stub",
                            sexp_s64vector_ref_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 5;
        (local_78->value).type.id = (sexp)0x4d;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"u64vector-set!",3,0,"sexp_u64vector_set_x_stub",
                            sexp_u64vector_set_x_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0x43e;
        (local_78->value).type.id = (sexp)0x4d;
        (local_78->value).port.offset = 5;
        (local_78->value).port.line = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"u64vector-ref",2,0,"sexp_u64vector_ref_stub",
                            sexp_u64vector_ref_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 5;
        (local_78->value).type.id = (sexp)0x4d;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"s32vector-set!",3,0,"sexp_s32vector_set_x_stub",
                            sexp_s32vector_set_x_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0x43e;
        (local_78->value).type.id = (sexp)0x4d;
        (local_78->value).port.offset = 5;
        (local_78->value).port.line = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"s32vector-ref",2,0,"sexp_s32vector_ref_stub",
                            sexp_s32vector_ref_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 5;
        (local_78->value).type.id = (sexp)0x4d;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"u32vector-set!",3,0,"sexp_u32vector_set_x_stub",
                            sexp_u32vector_set_x_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0x43e;
        (local_78->value).type.id = (sexp)0x4d;
        (local_78->value).port.offset = 5;
        (local_78->value).port.line = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"u32vector-ref",2,0,"sexp_u32vector_ref_stub",
                            sexp_u32vector_ref_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 5;
        (local_78->value).type.id = (sexp)0x4d;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"s16vector-set!",3,0,"sexp_s16vector_set_x_stub",
                            sexp_s16vector_set_x_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0x43e;
        (local_78->value).type.id = (sexp)0x4d;
        (local_78->value).port.offset = 5;
        (local_78->value).port.line = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"s16vector-ref",2,0,"sexp_s16vector_ref_stub",
                            sexp_s16vector_ref_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 5;
        (local_78->value).type.id = (sexp)0x4d;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"u16vector-set!",3,0,"sexp_u16vector_set_x_stub",
                            sexp_u16vector_set_x_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0x43e;
        (local_78->value).type.id = (sexp)0x4d;
        (local_78->value).port.offset = 5;
        (local_78->value).port.line = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"u16vector-ref",2,0,"sexp_u16vector_ref_stub",
                            sexp_u16vector_ref_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 5;
        (local_78->value).type.id = (sexp)0x4d;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"s8vector-set!",3,0,"sexp_s8vector_set_x_stub",
                            sexp_s8vector_set_x_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0x43e;
        (local_78->value).type.id = (sexp)0x4d;
        (local_78->value).port.offset = 5;
        (local_78->value).port.line = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"s8vector-ref",2,0,"sexp_s8vector_ref_stub",
                            sexp_s8vector_ref_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 5;
        (local_78->value).type.id = (sexp)0x4d;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"u1vector-set!",3,0,"sexp_u1vector_set_x_stub",
                            sexp_u1vector_set_x_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0x43e;
        (local_78->value).port.offset = 5;
        (local_78->value).port.line = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"u1vector-ref",2,0,"sexp_u1vector_ref_stub",
                            sexp_u1vector_ref_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 5;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"c128vector?",1,0,"sexp_c128vector_p_stub",
                            sexp_c128vector_p_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0xb;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"c64vector?",1,0,"sexp_c64vector_p_stub",sexp_c64vector_p_stub,0
                           );
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0xb;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"f64vector?",1,0,"sexp_f64vector_p_stub",sexp_f64vector_p_stub,0
                           );
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0xb;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"f32vector?",1,0,"sexp_f32vector_p_stub",sexp_f32vector_p_stub,0
                           );
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0xb;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"f16vector?",1,0,"sexp_f16vector_p_stub",sexp_f16vector_p_stub,0
                           );
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0xb;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"f8vector?",1,0,"sexp_f8vector_p_stub",sexp_f8vector_p_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0xb;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"s64vector?",1,0,"sexp_s64vector_p_stub",sexp_s64vector_p_stub,0
                           );
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0xb;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"u64vector?",1,0,"sexp_u64vector_p_stub",sexp_u64vector_p_stub,0
                           );
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0xb;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"s32vector?",1,0,"sexp_s32vector_p_stub",sexp_s32vector_p_stub,0
                           );
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0xb;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"u32vector?",1,0,"sexp_u32vector_p_stub",sexp_u32vector_p_stub,0
                           );
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0xb;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"s16vector?",1,0,"sexp_s16vector_p_stub",sexp_s16vector_p_stub,0
                           );
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0xb;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"u16vector?",1,0,"sexp_u16vector_p_stub",sexp_u16vector_p_stub,0
                           );
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0xb;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"s8vector?",1,0,"sexp_s8vector_p_stub",sexp_s8vector_p_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0xb;
        (local_78->value).port.offset = 5;
      }
      local_78 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"u1vector?",1,0,"sexp_u1vector_p_stub",sexp_u1vector_p_stub,0);
      if ((((ulong)local_78 & 3) == 0) && (local_78->tag == 0x1b)) {
        (local_78->value).bytecode.max_depth = 0xb;
        (local_78->value).port.offset = 5;
      }
      piVar2 = (int *)sexp_define_foreign_aux
                                (ctx,env,"uvector-length",1,0,"sexp_uvector_length_stub",
                                 sexp_uvector_length_stub,0);
      if ((((ulong)piVar2 & 3) == 0) && (*piVar2 == 0x1b)) {
        piVar2[10] = 5;
        piVar2[0xb] = 0;
      }
      (ctx->value).context.saves = local_60.next;
      psVar3 = (sexp_conflict)0x43e;
    }
  }
  return psVar3;
}

Assistant:

sexp sexp_init_library (sexp ctx, sexp self, sexp_sint_t n, sexp env, const char* version, const sexp_abi_identifier_t abi) {
  sexp_gc_var3(name, tmp, op);
  if (!(sexp_version_compatible(ctx, version, sexp_version)
        && sexp_abi_compatible(ctx, abi, SEXP_ABI_IDENTIFIER)))
    return SEXP_ABI_ERROR;
  sexp_gc_preserve3(ctx, name, tmp, op);
  name = sexp_intern(ctx, "SEXP_F16", 8);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_F16));
  name = sexp_intern(ctx, "SEXP_F8", 7);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_F8));
  name = sexp_intern(ctx, "SEXP_C128", 9);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_C128));
  name = sexp_intern(ctx, "SEXP_C64", 8);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_C64));
  name = sexp_intern(ctx, "SEXP_F64", 8);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_F64));
  name = sexp_intern(ctx, "SEXP_F32", 8);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_F32));
  name = sexp_intern(ctx, "SEXP_U64", 8);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_U64));
  name = sexp_intern(ctx, "SEXP_S64", 8);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_S64));
  name = sexp_intern(ctx, "SEXP_U32", 8);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_U32));
  name = sexp_intern(ctx, "SEXP_S32", 8);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_S32));
  name = sexp_intern(ctx, "SEXP_U16", 8);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_U16));
  name = sexp_intern(ctx, "SEXP_S16", 8);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_S16));
  name = sexp_intern(ctx, "SEXP_U8", 7);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_U8));
  name = sexp_intern(ctx, "SEXP_S8", 7);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_S8));
  name = sexp_intern(ctx, "SEXP_U1", 7);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_U1));
  op = sexp_define_foreign(ctx, env, "c128vector-set!", 3, sexp_c128vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "c128vector-ref", 2, sexp_c128vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "c64vector-set!", 3, sexp_c64vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "c64vector-ref", 2, sexp_c64vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "f64vector-set!", 3, sexp_f64vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FLONUM);
  }
  op = sexp_define_foreign(ctx, env, "f64vector-ref", 2, sexp_f64vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FLONUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "f32vector-set!", 3, sexp_f32vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FLONUM);
  }
  op = sexp_define_foreign(ctx, env, "f32vector-ref", 2, sexp_f32vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FLONUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "f16vector-set!", 3, sexp_f16vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FLONUM);
  }
  op = sexp_define_foreign(ctx, env, "f16vector-ref", 2, sexp_f16vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FLONUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "f8vector-set!", 3, sexp_f8vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FLONUM);
  }
  op = sexp_define_foreign(ctx, env, "f8vector-ref", 2, sexp_f8vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FLONUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s64vector-set!", 3, sexp_s64vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s64vector-ref", 2, sexp_s64vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u64vector-set!", 3, sexp_u64vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u64vector-ref", 2, sexp_u64vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s32vector-set!", 3, sexp_s32vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s32vector-ref", 2, sexp_s32vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u32vector-set!", 3, sexp_u32vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u32vector-ref", 2, sexp_u32vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s16vector-set!", 3, sexp_s16vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s16vector-ref", 2, sexp_s16vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u16vector-set!", 3, sexp_u16vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u16vector-ref", 2, sexp_u16vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s8vector-set!", 3, sexp_s8vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s8vector-ref", 2, sexp_s8vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u1vector-set!", 3, sexp_u1vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u1vector-ref", 2, sexp_u1vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "c128vector?", 1, sexp_c128vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "c64vector?", 1, sexp_c64vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "f64vector?", 1, sexp_f64vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "f32vector?", 1, sexp_f32vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "f16vector?", 1, sexp_f16vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "f8vector?", 1, sexp_f8vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s64vector?", 1, sexp_s64vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u64vector?", 1, sexp_u64vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s32vector?", 1, sexp_s32vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u32vector?", 1, sexp_u32vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s16vector?", 1, sexp_s16vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u16vector?", 1, sexp_u16vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s8vector?", 1, sexp_s8vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u1vector?", 1, sexp_u1vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "uvector-length", 1, sexp_uvector_length_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  sexp_gc_release3(ctx);
  return SEXP_VOID;
}